

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

int NGA_Sprs_array_get_block
              (int s_a,int irow,int icol,int **idx,int **jdx,void **data,int *ilo,int *ihi,int *jlo,
              int *jhi)

{
  logical lVar1;
  void *jd;
  Integer jh;
  void *id;
  Integer jl;
  Integer ih;
  Integer il;
  
  lVar1 = pnga_sprs_array_get_block((long)s_a,(long)irow,(long)icol,&id,&jd,data,&il,&ih,&jl,&jh);
  *ilo = (int)il + -1;
  *ihi = (int)ih + -1;
  *jlo = (int)jl + -1;
  *jhi = (int)jh + -1;
  *idx = (int *)id;
  *jdx = (int *)jd;
  return (int)lVar1;
}

Assistant:

int NGA_Sprs_array_get_block(int s_a, int irow, int icol, int **idx,
    int **jdx, void **data, int *ilo, int *ihi, int *jlo, int *jhi)
{
  Integer sa = (Integer)s_a;
  Integer ir = (Integer)irow;
  Integer ic = (Integer)icol;
  Integer il, ih, jl, jh;
  void *id, *jd;
  int ret = wnga_sprs_array_get_block(sa, ir, ic, &id, &jd, data,
      &il, &ih, &jl, &jh);
  *ilo = (int)il-1;
  *ihi = (int)ih-1;
  *jlo = (int)jl-1;
  *jhi = (int)jh-1;
  *idx = (int*)id;
  *jdx = (int*)jd;
  return ret;
}